

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

size_t Imf_3_4::bytesPerDeepLineTable
                 (Header *header,int minY,int maxY,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  uint uVar7;
  int iVar8;
  Box2i *pBVar9;
  ChannelList *this;
  const_iterator cVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  int *piVar25;
  
  pBVar9 = Header::dataWindow(header);
  this = Header::channels(header);
  cVar10._M_node = (_Base_ptr)ChannelList::begin(this);
  cVar11._M_node = (_Base_ptr)ChannelList::end(this);
  if (cVar10._M_node != cVar11._M_node) {
    do {
      uVar2 = *(uint *)&cVar10._M_node[9]._M_parent;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      uVar3 = *(uint *)&cVar10._M_node[9].field_0x4;
      iVar8 = pixelTypeSize(cVar10._M_node[9]._M_color);
      iVar22 = minY + -1 + uVar7;
      iVar22 = iVar22 - iVar22 % (int)uVar7;
      iVar17 = maxY - maxY % (int)uVar7;
      if (iVar22 <= iVar17) {
        iVar4 = (pBVar9->min).x;
        iVar18 = (pBVar9->max).x;
        uVar7 = -uVar3;
        if (0 < (int)uVar3) {
          uVar7 = uVar3;
        }
        iVar18 = iVar18 - iVar18 % (int)uVar7;
        iVar20 = iVar4 + uVar7 + -1;
        uVar15 = iVar20 % (int)uVar7;
        iVar20 = iVar20 - uVar15;
        iVar5 = (pBVar9->min).y;
        puVar6 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar23 = (long)iVar22;
        uVar24 = -uVar2;
        uVar3 = uVar2;
        if ((int)uVar2 < 1) {
          uVar3 = uVar24;
        }
        piVar16 = (int *)(base + (long)iVar20 * (long)xStride + yStride * lVar23);
        if (uVar2 != uVar24 && SBORROW4(uVar2,uVar24) == (int)(uVar2 * 2) < 0) {
          uVar24 = uVar2;
        }
        do {
          if (iVar18 < iVar20) {
            lVar19 = 0;
          }
          else {
            lVar19 = 0;
            lVar14 = (long)(int)(~uVar15 + iVar4 + uVar7);
            piVar25 = piVar16;
            do {
              lVar19 = lVar19 + (long)*piVar25 * (long)iVar8;
              lVar14 = lVar14 + (ulong)uVar7;
              piVar25 = (int *)((long)piVar25 + (long)xStride * (ulong)uVar7);
            } while (lVar14 <= iVar18);
          }
          puVar1 = puVar6 + (lVar23 - iVar5);
          *puVar1 = *puVar1 + lVar19;
          lVar23 = lVar23 + (ulong)uVar3;
          piVar16 = (int *)((long)piVar16 + (ulong)uVar24 * (long)yStride);
        } while (lVar23 <= iVar17);
      }
      cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
      CVar12 = ChannelList::end(this);
    } while ((const_iterator)cVar10._M_node != CVar12._i._M_node);
  }
  if (maxY < minY) {
    uVar13 = 0;
  }
  else {
    lVar23 = 0;
    uVar21 = 0;
    do {
      uVar13 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[(minY + lVar23) - (long)(pBVar9->min).y];
      if (uVar13 < uVar21) {
        uVar13 = uVar21;
      }
      lVar23 = lVar23 + 1;
      uVar21 = uVar13;
    } while ((maxY - minY) + 1 != (int)lVar23);
  }
  return uVar13;
}

Assistant:

size_t
bytesPerDeepLineTable (
    const Header&   header,
    int             minY,
    int             maxY,
    const char*     base,
    int             xStride,
    int             yStride,
    vector<size_t>& bytesPerLine)
{
    const Box2i&       dataWindow = header.dataWindow ();
    const ChannelList& channels   = header.channels ();

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        const int      ySampling = abs (c.channel ().ySampling);
        const int      xSampling = abs (c.channel ().xSampling);
        const uint64_t pixelSize = pixelTypeSize (c.channel ().type);

        // Here we transform from the domain over all pixels into the domain
        // of actual samples.  We want to sample points in [minY, maxY] where
        // (y % ySampling) == 0.  However, doing this by rejecting samples
        // requires O(height*width) modulo computations, which were a
        // significant bottleneck in the previous implementation of this
        // function.  For the low, low price of 4 divisions per channel, we
        // can tighten the y & x ranges to the least and greatest roots of the
        // sampling function and then stride by the sampling rate.
        const int sampleMinY = roundToNextMultiple (minY, ySampling);
        const int sampleMaxY = roundToPrevMultiple (maxY, ySampling);
        const int sampleMinX =
            roundToNextMultiple (dataWindow.min.x, xSampling);
        const int sampleMaxX =
            roundToPrevMultiple (dataWindow.max.x, xSampling);

        for (int y = sampleMinY; y <= sampleMaxY; y += ySampling)
        {
            uint64_t nBytes = 0;
            for (int x = sampleMinX; x <= sampleMaxX; x += xSampling)
            {
                nBytes += pixelSize * static_cast<uint64_t> (sampleCount (
                                          base, xStride, yStride, x, y));
            }

            //
            // architectures where size_t is smaller than 64 bits may overflow
            // (scanlines with more than 2^32 bytes are not currently supported so this should not occur with valid files)
            //
            if (static_cast<uint64_t> (bytesPerLine[y - dataWindow.min.y]) +
                    nBytes >
                SIZE_MAX)
            {
                throw IEX_NAMESPACE::IoExc ("Scanline size too large");
            }

            bytesPerLine[y - dataWindow.min.y] += nBytes;
        }
    }

    size_t maxBytesPerLine = 0;

    for (int y = minY; y <= maxY; ++y)
    {
        if (maxBytesPerLine < bytesPerLine[y - dataWindow.min.y])
        {
            maxBytesPerLine = bytesPerLine[y - dataWindow.min.y];
        }
    }

    return maxBytesPerLine;
}